

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::printGridInfo(Amr *this,ostream *os,int min_lev,int max_lev)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  pointer pGVar4;
  Amr *pAVar5;
  Long LVar6;
  ostream *poVar7;
  uint uVar8;
  int i;
  long lVar9;
  ulong uVar10;
  char local_7d;
  int local_7c;
  BATransformer *local_78;
  __uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> local_70;
  long local_68;
  Amr *local_60;
  long local_58;
  Box local_4c;
  
  local_7c = max_lev;
  local_60 = this;
  if (min_lev <= max_lev) {
    lVar9 = (long)min_lev;
    local_7c = max_lev + 1;
    do {
      pAVar5 = local_60;
      local_70._M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (local_60->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t;
      lVar3 = (long)(((shared_ptr<amrex::BARef> *)
                     ((long)local_70._M_t.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x120))
                    ->super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar8 = (int)(*(long *)(lVar3 + 8) - *(long *)lVar3 >> 2) * -0x49249249;
      LVar6 = AmrLevel::countCells
                        ((AmrLevel *)
                         local_70._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
      pGVar4 = (pAVar5->super_AmrCore).super_AmrMesh.geom.
               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = *(undefined8 *)pGVar4[lVar9].domain.bigend.vect;
      uVar2 = *(undefined8 *)&pGVar4[lVar9].domain.smallend;
      local_78 = (BATransformer *)
                 (((double)LVar6 * 100.0) /
                 ((double)((*(int *)((long)&pGVar4[lVar9].domain.bigend + 8) -
                           *(int *)((long)&pGVar4[lVar9].domain.smallend + 8)) + 1) *
                 (double)(((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1) *
                 (double)(((int)uVar1 - (int)uVar2) + 1)));
      local_58 = *(long *)(*(long *)((long)(pAVar5->amr_level).
                                           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                           .
                                           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_t.
                                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                    + 0x170) + 200);
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Level ",8);
      local_68 = lVar9;
      poVar7 = (ostream *)std::ostream::operator<<(os,(int)lVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   ",3);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," grids  ",8);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," cells  ",8);
      poVar7 = std::ostream::_M_insert<double>((double)local_78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," % of domain",0xc);
      local_4c.smallend.vect[0]._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_4c,1);
      if (0 < (int)uVar8) {
        local_78 = (BATransformer *)
                   ((long)local_70._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8);
        uVar10 = 0;
        do {
          BATransformer::operator()
                    (&local_4c,local_78,
                     (Box *)(uVar10 * 0x1c +
                            *(long *)&(((((BoxArray *)
                                         ((long)local_70._M_t.
                                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                                _M_head_impl + 0xd8))->m_ref).
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data));
          local_7d = ' ';
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_7d,1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
          poVar7 = amrex::operator<<(poVar7,&local_4c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   ",3);
          lVar9 = 0;
          do {
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               (os,(local_4c.bigend.vect[lVar9] - local_4c.smallend.vect[lVar9]) + 1
                               );
            local_7d = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_7d,1);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          std::__ostream_insert<char,std::char_traits<char>>(os,":: ",3);
          poVar7 = (ostream *)
                   std::ostream::operator<<(os,*(int *)(**(long **)(local_58 + 0x70) + uVar10 * 4));
          local_7d = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_7d,1);
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uVar8 & 0x7fffffff));
      }
      lVar9 = local_68 + 1;
    } while (local_7c != (int)lVar9);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

void
Amr::printGridInfo (std::ostream& os,
                    int           min_lev,
                    int           max_lev)
{
    for (int lev = min_lev; lev <= max_lev; lev++)
    {
        const BoxArray&           bs      = amr_level[lev]->boxArray();
        int                       numgrid = bs.size();
        Long                      ncells  = amr_level[lev]->countCells();
        double                    ntot    = Geom(lev).Domain().d_numPts();
        Real                      frac    = Real(100.0 * double(ncells) / ntot);
        const DistributionMapping& map    = amr_level[lev]->get_new_data(0).DistributionMap();

        os << "  Level "
           << lev
           << "   "
           << numgrid
           << " grids  "
           << ncells
           << " cells  "
           << frac
           << " % of domain"
           << '\n';


        for (int k = 0; k < numgrid; k++)
        {
            const Box& b = bs[k];

            os << ' ' << lev << ": " << b << "   ";

            for (int i = 0; i < AMREX_SPACEDIM; i++)
                os << b.length(i) << ' ';

            os << ":: " << map[k] << '\n';
        }
    }

    os << std::endl; // Make sure we flush!
}